

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeSamplerType(Builder *this)

{
  Id IVar1;
  size_type sVar2;
  Instruction *this_00;
  reference ppIVar3;
  size_t in_RSI;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_30 [3];
  pointer local_18;
  Instruction *type;
  Builder *this_local;
  
  type = (Instruction *)this;
  sVar2 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::size
                    (this->groupedTypes + 0x1a);
  if (sVar2 == 0) {
    this_00 = (Instruction *)Instruction::operator_new((Instruction *)0x38,in_RSI);
    IVar1 = getUniqueId(this);
    Instruction::Instruction(this_00,IVar1,0,OpTypeSampler);
    local_18 = this_00;
    std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::push_back
              (this->groupedTypes + 0x1a,&local_18);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_30,
               local_18);
    std::
    vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::push_back(&this->constantsTypesGlobals,(value_type *)local_30);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_30)
    ;
    Module::mapInstruction(&this->module,local_18);
  }
  else {
    ppIVar3 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
              back(this->groupedTypes + 0x1a);
    local_18 = *ppIVar3;
  }
  IVar1 = Instruction::getResultId(local_18);
  return IVar1;
}

Assistant:

Id Builder::makeSamplerType()
{
    Instruction* type;
    if (groupedTypes[OpTypeSampler].size() == 0) {
        type = new Instruction(getUniqueId(), NoType, OpTypeSampler);
        groupedTypes[OpTypeSampler].push_back(type);
        constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
        module.mapInstruction(type);
    } else
        type = groupedTypes[OpTypeSampler].back();

    return type->getResultId();
}